

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

bool __thiscall SQInstance::InstanceOf(SQInstance *this,SQClass *trg)

{
  SQClass *parent;
  SQClass *trg_local;
  SQInstance *this_local;
  
  parent = this->_class;
  while( true ) {
    if (parent == (SQClass *)0x0) {
      return false;
    }
    if (parent == trg) break;
    parent = parent->_base;
  }
  return true;
}

Assistant:

bool SQInstance::InstanceOf(SQClass *trg)
{
    SQClass *parent = _class;
    while(parent != NULL) {
        if(parent == trg)
            return true;
        parent = parent->_base;
    }
    return false;
}